

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_interfaces.c
# Opt level: O0

void nhdp_interface_remove(nhdp_interface *interf)

{
  list_entity *plVar1;
  list_entity *__tempptr_7;
  list_entity *__tempptr_6;
  list_entity *__tempptr_5;
  list_entity *__tempptr_4;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  nhdp_link *l_it;
  nhdp_link *lnk;
  nhdp_interface_addr *a_it;
  nhdp_interface_addr *addr;
  nhdp_interface *interf_local;
  
  if (((&log_global_mask)[LOG_NHDP] & 2) != 0) {
    oonf_log(2,LOG_NHDP,"src/nhdp/nhdp/nhdp_interfaces.c",0x118,0,0,
             "Remove interface to NHDP_interface tree: %s (refcount was %d)",(interf->_node).key,
             interf->_refcount);
  }
  if (interf->_refcount < 2) {
    oonf_class_event(&_interface_info,interf,OONF_OBJECT_REMOVED);
    netaddr_acl_remove(&interf->ifaddr_filter);
    oonf_timer_stop(&interf->_hello_timer);
    plVar1 = (interf->_if_addresses).list_head.next;
    a_it = (nhdp_interface_addr *)&plVar1[-9].prev;
    plVar1 = plVar1->next;
    while( true ) {
      lnk = (nhdp_link *)&plVar1[-9].prev;
      if ((a_it->_if_node).list.prev == (interf->_if_addresses).list_head.prev) break;
      _remove_addr(a_it);
      a_it = (nhdp_interface_addr *)lnk;
      plVar1 = plVar1->next;
    }
    plVar1 = (interf->_links).next;
    l_it = (nhdp_link *)&plVar1[-0x1f].prev;
    plVar1 = plVar1->next;
    while( true ) {
      __tempptr = (list_entity *)&plVar1[-0x1f].prev;
      if ((l_it->_if_node).prev == (interf->_links).prev) break;
      nhdp_db_link_set_unsymmetric(l_it);
      l_it = (nhdp_link *)__tempptr;
      plVar1 = plVar1->next;
    }
    avl_remove(&_interface_tree,&interf->_node);
    os_interface_linux_remove(&interf->os_if_listener);
    oonf_rfc5444_remove_interface((interf->rfc5444_if).interface,&interf->rfc5444_if);
    oonf_class_free(&_interface_info,interf);
  }
  else {
    interf->_refcount = interf->_refcount + -1;
  }
  return;
}

Assistant:

void
nhdp_interface_remove(struct nhdp_interface *interf) {
  struct nhdp_interface_addr *addr, *a_it;
  struct nhdp_link *lnk, *l_it;

  OONF_INFO(LOG_NHDP, "Remove interface to NHDP_interface tree: %s (refcount was %d)", nhdp_interface_get_name(interf),
    interf->_refcount);

  if (interf->_refcount > 1) {
    /* there are still users left */
    interf->_refcount--;
    return;
  }

  /* trigger event */
  oonf_class_event(&_interface_info, interf, OONF_OBJECT_REMOVED);

  /* free filter */
  netaddr_acl_remove(&interf->ifaddr_filter);

  /* stop Hellos */
  oonf_timer_stop(&interf->_hello_timer);

  avl_for_each_element_safe(&interf->_if_addresses, addr, _if_node, a_it) {
    _remove_addr(addr);
  }

  list_for_each_element_safe(&interf->_links, lnk, _if_node, l_it) {
    nhdp_db_link_set_unsymmetric(lnk);
  }

  /* remove first from tree because we use the interface name as a key */
  avl_remove(&_interface_tree, &interf->_node);

  /* now clean up the rest */
  os_interface_remove(&interf->os_if_listener);
  oonf_rfc5444_remove_interface(interf->rfc5444_if.interface, &interf->rfc5444_if);
  oonf_class_free(&_interface_info, interf);
}